

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O0

bool SignTaprootScript(SigningProvider *provider,BaseSignatureCreator *creator,
                      SignatureData *sigdata,int leaf_version,Span<const_unsigned_char> script_bytes
                      ,vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *result)

{
  Span<const_unsigned_char> script_00;
  bool bVar1;
  Availability AVar2;
  SignatureData *sig_data;
  int in_ECX;
  long in_FS_OFFSET;
  NodeRef<typename_TapSatisfier::Key> ms;
  TapSatisfier ms_satisfier;
  CScript script;
  uint256 leaf_hash;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  undefined4 in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  Node<XOnlyPubKey> *this;
  SigningProvider *provider_00;
  TapSatisfier *this_00;
  uchar *in_stack_ffffffffffffff20;
  TapSatisfier *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  bool local_a9;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ECX == 0xc0) {
    this_00 = (TapSatisfier *)(local_58 + 0x30);
    script_00.m_size = (size_t)in_stack_ffffffffffffff28;
    script_00.m_data = in_stack_ffffffffffffff20;
    ComputeTapleafHash((uint8_t)((ulong)this_00 >> 0x38),script_00);
    this = (Node<XOnlyPubKey> *)local_58;
    sig_data = (SignatureData *)
               Span<const_unsigned_char>::begin
                         ((Span<const_unsigned_char> *)
                          CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    Span<const_unsigned_char>::end
              ((Span<const_unsigned_char> *)
               CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    provider_00 = (SigningProvider *)(local_58 + 0x10);
    CScript::CScript<const_unsigned_char_*>
              ((CScript *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               (uchar *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (uchar *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    TapSatisfier::TapSatisfier
              (this_00,provider_00,sig_data,(BaseSignatureCreator *)this,
               (CScript *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               (uint256 *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    miniscript::FromScript<TapSatisfier>
              ((CScript *)CONCAT44(in_ECX,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28);
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>
                        *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    in_stack_fffffffffffffefc = in_stack_fffffffffffffefc & 0xffffff;
    if (bVar1) {
      std::
      __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
      AVar2 = miniscript::Node<XOnlyPubKey>::Satisfy<TapSatisfier>
                        (this,(TapSatisfier *)
                              CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                         (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                         (bool)in_stack_fffffffffffffeef);
      in_stack_fffffffffffffefc = (uint)(AVar2 == YES) << 0x18;
    }
    local_a9 = SUB41(in_stack_fffffffffffffefc >> 0x18,0);
    std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>::~shared_ptr
              ((shared_ptr<const_miniscript::Node<XOnlyPubKey>_> *)
               CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    CScript::~CScript((CScript *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  }
  else {
    local_a9 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_a9;
}

Assistant:

static bool SignTaprootScript(const SigningProvider& provider, const BaseSignatureCreator& creator, SignatureData& sigdata, int leaf_version, Span<const unsigned char> script_bytes, std::vector<valtype>& result)
{
    // Only BIP342 tapscript signing is supported for now.
    if (leaf_version != TAPROOT_LEAF_TAPSCRIPT) return false;

    uint256 leaf_hash = ComputeTapleafHash(leaf_version, script_bytes);
    CScript script = CScript(script_bytes.begin(), script_bytes.end());

    TapSatisfier ms_satisfier{provider, sigdata, creator, script, leaf_hash};
    const auto ms = miniscript::FromScript(script, ms_satisfier);
    return ms && ms->Satisfy(ms_satisfier, result) == miniscript::Availability::YES;
}